

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Writer.cpp
# Opt level: O0

void __thiscall adios2::core::engine::BP3Writer::~BP3Writer(BP3Writer *this)

{
  undefined8 in_RDX;
  Engine *in_RDI;
  
  ((BP3Base *)&in_RDI->_vptr_Engine)->_vptr_BP3Base = (_func_int **)&PTR__BP3Writer_0112dc48;
  if ((in_RDI->m_IsOpen & 1U) != 0) {
    (*((BP3Base *)&in_RDI->_vptr_Engine)->_vptr_BP3Base[0x85])
              (in_RDI,(ulong)in_RDI->m_FailVerbose & 1,in_RDX,
               CONCAT71(0x112dc,in_RDI->m_FailVerbose) & 0xffffffffffffff01);
  }
  in_RDI->m_IsOpen = false;
  transportman::TransportMan::~TransportMan((TransportMan *)0x9fbc8c);
  transportman::TransportMan::~TransportMan((TransportMan *)0x9fbc9d);
  adios2::format::BP3Serializer::~BP3Serializer((BP3Serializer *)in_RDI);
  Engine::~Engine(in_RDI);
  return;
}

Assistant:

BP3Writer::~BP3Writer()
{
    if (m_IsOpen)
    {
        DestructorClose(m_FailVerbose);
    }
    m_IsOpen = false;
}